

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::StrContainsIgnoreCase(lts_20250127 *this,string_view haystack,char needle)

{
  void *pvVar1;
  size_t __n_00;
  ulong uVar2;
  void *__s;
  lts_20250127 *plVar3;
  size_type __n;
  char both_cstr [3];
  char local_2b;
  char local_2a;
  undefined1 local_29;
  
  __s = (void *)haystack._M_len;
  uVar2 = (ulong)haystack._M_str & 0xff;
  local_2a = ascii_internal::kToUpper[uVar2];
  local_2b = ascii_internal::kToLower[uVar2];
  if (local_2a == local_2b) {
    if (this != (lts_20250127 *)0x0) {
      pvVar1 = memchr(__s,(int)(char)haystack._M_str,(size_t)this);
      return (long)pvVar1 - (long)__s != -1 && pvVar1 != (void *)0x0;
    }
  }
  else {
    local_29 = 0;
    __n_00 = strlen(&local_2b);
    if (this != (lts_20250127 *)0x0 && __n_00 != 0) {
      plVar3 = (lts_20250127 *)0x0;
      do {
        pvVar1 = memchr(&local_2b,(int)(char)*(lts_20250127 *)((long)__s + (long)plVar3),__n_00);
        if (pvVar1 != (void *)0x0) goto LAB_00ffbc9c;
        plVar3 = plVar3 + 1;
      } while (this != plVar3);
      plVar3 = (lts_20250127 *)0xffffffffffffffff;
LAB_00ffbc9c:
      return plVar3 != (lts_20250127 *)0xffffffffffffffff;
    }
  }
  return false;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           char needle) noexcept {
  char upper_needle = absl::ascii_toupper(static_cast<unsigned char>(needle));
  char lower_needle = absl::ascii_tolower(static_cast<unsigned char>(needle));
  if (upper_needle == lower_needle) {
    return StrContains(haystack, needle);
  } else {
    const char both_cstr[3] = {lower_needle, upper_needle, '\0'};
    return haystack.find_first_of(both_cstr) != absl::string_view::npos;
  }
}